

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Session::useConfigData(Session *this,ConfigData *configData)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  ConfigData *pCVar9;
  ConfigData *pCVar10;
  
  pCVar9 = configData;
  pCVar10 = &this->m_configData;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    bVar1 = pCVar9->listTags;
    bVar2 = pCVar9->listReporters;
    bVar3 = pCVar9->listTestNamesOnly;
    bVar4 = pCVar9->showSuccessfulTests;
    bVar5 = pCVar9->shouldDebugBreak;
    bVar6 = pCVar9->noThrow;
    bVar7 = pCVar9->showHelp;
    pCVar10->listTests = pCVar9->listTests;
    pCVar10->listTags = bVar1;
    pCVar10->listReporters = bVar2;
    pCVar10->listTestNamesOnly = bVar3;
    pCVar10->showSuccessfulTests = bVar4;
    pCVar10->shouldDebugBreak = bVar5;
    pCVar10->noThrow = bVar6;
    pCVar10->showHelp = bVar7;
    pCVar9 = (ConfigData *)&pCVar9->showInvisibles;
    pCVar10 = (ConfigData *)&pCVar10->showInvisibles;
  }
  (this->m_configData).waitForKeypress = configData->waitForKeypress;
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).outputFilename);
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).name);
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).processName);
  std::__cxx11::string::_M_assign((string *)&(this->m_configData).reporterName);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->m_configData).testsOrTags,&configData->testsOrTags);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->m_configData).sectionsToRun,&configData->sectionsToRun);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void Session::useConfigData( ConfigData const& configData ) {
        m_configData = configData;
        m_config.reset();
    }